

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O3

int Assimp_Extract(char **params,uint num)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  aiTexture *tx;
  uint uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  aiScene *paVar12;
  FILE *__s;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  bool bVar17;
  size_type sVar18;
  char *unaff_R13;
  bool bVar19;
  bool bVar20;
  string out_cpy;
  string extension;
  string out;
  char tmp [10];
  string out_ext;
  string in;
  ImportData import;
  long *local_148 [2];
  long local_138 [2];
  uint local_124;
  aiScene *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  char local_b2 [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  ulong local_68;
  ImportData local_60;
  
  if (num == 0) {
    puts("assimp extract: Invalid number of arguments. See \'assimp extract --help\'");
    return 1;
  }
  pcVar16 = *params;
  if (*pcVar16 == '-') {
    if ((((pcVar16[1] == 'h') && (pcVar16[2] == '\0')) ||
        (iVar8 = strcmp(pcVar16,"--help"), iVar8 == 0)) ||
       ((pcVar16[1] == '?' && (pcVar16[2] == '\0')))) {
LAB_002e25f8:
      printf("%s",AICMD_MSG_DUMP_HELP_E);
      return 0;
    }
  }
  else {
    iVar8 = strcmp(pcVar16,"--help");
    if (iVar8 == 0) goto LAB_002e25f8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,pcVar16,(allocator<char> *)&local_60);
  if (num == 1) {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"-","");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,params[1],(allocator<char> *)&local_60);
  }
  local_60.logFile._M_dataplus._M_p = (pointer)&local_60.logFile.field_2;
  local_60.ppFlags = 0;
  local_60.showLog = false;
  local_60.logFile._M_string_length = 0;
  local_60.logFile.field_2._M_local_buf[0] = '\0';
  local_60.verbose = false;
  local_60.log = false;
  ProcessStandardArguments(&local_60,params + 1,num - 1);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"bmp","");
  uVar9 = ((char)*local_d8 != '-') + 1;
  if (uVar9 < num) {
    uVar13 = (ulong)uVar9;
    uVar9 = 0xffffffff;
    local_124 = 0;
    bVar6 = 0;
    local_120 = (aiScene *)params;
    do {
      unaff_R13 = *(char **)(&((aiScene *)params)->mFlags + uVar13 * 2);
      if (unaff_R13 == (char *)0x0) goto LAB_002e295e;
      cVar7 = *unaff_R13;
      if ((cVar7 == '-') && (unaff_R13[1] == 'f')) {
        local_148[0] = local_138;
        sVar10 = strlen(unaff_R13 + 2);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_148,unaff_R13 + 2,unaff_R13 + sVar10 + 2);
LAB_002e2832:
        std::__cxx11::string::operator=((string *)&local_f8,(string *)local_148);
        params = (char **)local_120;
        if (local_148[0] != local_138) {
          operator_delete(local_148[0],local_138[0] + 1);
          params = (char **)local_120;
        }
      }
      else {
        iVar8 = strncmp(unaff_R13,"--format=",9);
        if (iVar8 == 0) {
          local_148[0] = local_138;
          sVar10 = strlen(unaff_R13 + 9);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_148,unaff_R13 + 9,unaff_R13 + sVar10 + 9);
          goto LAB_002e2832;
        }
        iVar8 = strcmp(unaff_R13,"--nosuffix");
        if (iVar8 == 0) {
          bVar6 = 1;
        }
        else if (cVar7 == '-') {
          if (unaff_R13[1] == 's') {
            if (unaff_R13[2] == '\0') {
              bVar6 = 1;
              goto LAB_002e295e;
            }
            iVar8 = strncmp(unaff_R13,"--texture=",10);
            if (iVar8 != 0) goto LAB_002e28b5;
LAB_002e291d:
            cVar7 = unaff_R13[10];
            if (0xf5 < (byte)(cVar7 - 0x3aU)) {
              unaff_R13 = unaff_R13 + 0xb;
              uVar9 = 0;
              do {
                uVar9 = (uint)(byte)(cVar7 - 0x30) + uVar9 * 10;
                cVar7 = *unaff_R13;
                unaff_R13 = unaff_R13 + 1;
              } while (0xf5 < (byte)(cVar7 - 0x3aU));
              goto LAB_002e295e;
            }
          }
          else {
            iVar8 = strncmp(unaff_R13,"--texture=",10);
            if (iVar8 == 0) goto LAB_002e291d;
LAB_002e28b5:
            if (unaff_R13[1] != 't') goto LAB_002e28ed;
            cVar7 = unaff_R13[2];
            if (0xf5 < (byte)(cVar7 - 0x3aU)) {
              unaff_R13 = unaff_R13 + 3;
              uVar9 = 0;
              do {
                uVar9 = (uint)(byte)(cVar7 - 0x30) + uVar9 * 10;
                cVar7 = *unaff_R13;
                unaff_R13 = unaff_R13 + 1;
              } while (0xf5 < (byte)(cVar7 - 0x3aU));
              goto LAB_002e295e;
            }
          }
          uVar9 = 0;
        }
        else {
          iVar8 = strncmp(unaff_R13,"--texture=",10);
          if (iVar8 == 0) goto LAB_002e291d;
LAB_002e28ed:
          iVar8 = strcmp(unaff_R13,"-ba");
          if ((iVar8 == 0) || (iVar8 = strcmp(unaff_R13,"--bmp-with-alpha"), iVar8 == 0)) {
            local_124 = 1;
          }
        }
      }
LAB_002e295e:
      uVar13 = uVar13 + 1;
    } while ((uint)uVar13 != num);
  }
  else {
    bVar6 = 0;
    uVar9 = 0xffffffff;
    local_124 = 0;
  }
  sVar5 = local_f8._M_string_length;
  _Var4._M_p = local_f8._M_dataplus._M_p;
  if (local_f8._M_string_length != 0) {
    sVar18 = 0;
    do {
      iVar8 = tolower((int)_Var4._M_p[sVar18]);
      _Var4._M_p[sVar18] = (char)iVar8;
      sVar18 = sVar18 + 1;
    } while (sVar5 != sVar18);
  }
  if ((char)*local_d8 == '-') {
    std::__cxx11::string::rfind((char)&local_88,0x2e);
    std::__cxx11::string::substr((ulong)local_148,(ulong)&local_88);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_148);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
  }
  lVar11 = std::__cxx11::string::rfind((char)&local_d8,0x2e);
  if (lVar11 != -1) {
    std::__cxx11::string::substr((ulong)local_148,(ulong)&local_d8);
    std::__cxx11::string::operator=((string *)&local_f8,(string *)local_148);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_148,(ulong)&local_d8);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_148);
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
  }
  paVar12 = ImportModel(&local_60,&local_88);
  if (paVar12 == (aiScene *)0x0) {
    printf("assimp extract: Unable to load input file %s\n",local_88._M_dataplus._M_p);
    iVar8 = 5;
  }
  else {
    local_120 = paVar12;
    if (uVar9 == 0xffffffff) {
      unaff_R13 = (char *)0x0;
      iVar8 = 0;
      printf("assimp extract: Exporting %i textures\n",(ulong)paVar12->mNumTextures);
      if (local_120->mNumTextures == 0) goto LAB_002e2ed9;
    }
    else if (paVar12->mNumTextures <= uVar9) {
      printf("assimp extract: Texture %i requested, but there are just %i textures\n",(ulong)uVar9);
      iVar8 = 6;
      goto LAB_002e2ed9;
    }
    paVar2 = &local_118.field_2;
    uVar13 = (ulong)uVar9;
    uVar14 = 0;
    paVar12 = local_120;
    local_68 = uVar13;
    do {
      if (uVar9 == 0xffffffff || uVar14 == uVar13) {
        tx = paVar12->mTextures[uVar14];
        local_148[0] = local_138;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,local_d8,(char *)((long)local_d8 + local_d0));
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_f8._M_dataplus._M_p,
                   local_f8._M_dataplus._M_p + local_f8._M_string_length);
        if (!(bool)(bVar6 & uVar9 != 0xffffffff)) {
          std::__cxx11::string::append((char *)local_148);
          uVar15 = 1;
          if ((int)uVar14 < 0) {
            local_b2[0] = '-';
            uVar13 = (ulong)(uint)-(int)uVar14;
            uVar15 = 2;
            pcVar16 = local_b2 + 1;
          }
          else {
            pcVar16 = local_b2;
            uVar13 = uVar14 & 0xffffffff;
          }
          iVar8 = 1000000000;
          bVar17 = false;
          do {
            lVar11 = (long)(int)uVar13 / (long)iVar8;
            bVar19 = (int)lVar11 != 0;
            bVar20 = iVar8 == 1;
            if ((bVar17 || bVar20) || bVar19) {
              pcVar1 = pcVar16 + 1;
              *pcVar16 = (char)lVar11 + '0';
              pcVar16 = pcVar1;
              if (iVar8 == 1) break;
              uVar15 = uVar15 + 1;
              uVar13 = (long)(int)uVar13 % (long)iVar8 & 0xffffffff;
            }
            iVar8 = iVar8 / 10;
            bVar17 = (bool)(bVar17 | bVar20 | bVar19);
          } while (uVar15 < 10);
          *pcVar16 = '\0';
          local_118._M_dataplus._M_p = (pointer)paVar2;
          sVar10 = strlen(local_b2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,local_b2,local_b2 + sVar10);
          std::__cxx11::string::_M_append((char *)local_148,(ulong)local_118._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        if (tx->mHeight == 0) {
          pcVar16 = tx->achFormatHint;
          printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                 uVar14 & 0xffffffff,pcVar16);
          local_118._M_dataplus._M_p = (pointer)paVar2;
          sVar10 = strlen(pcVar16);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,pcVar16,tx->achFormatHint + sVar10);
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+(&local_118,".",&local_a8);
        std::__cxx11::string::_M_append((char *)local_148,(ulong)local_118._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        __s = fopen((char *)local_148[0],"wb");
        if (__s == (FILE *)0x0) {
          bVar17 = false;
          printf("assimp extract: Unable to open output file %s\n",local_148[0]);
          unaff_R13 = (char *)0x7;
        }
        else {
          if (tx->mHeight == 0) {
            sVar10 = fwrite(tx->pcData,(ulong)tx->mWidth,1,__s);
            uVar15 = (uint)(sVar10 != 1);
          }
          else {
            uVar15 = DoExport(tx,(FILE *)__s,&local_f8,local_124);
          }
          fclose(__s);
          printf("assimp extract: Wrote texture %i to %s\n",uVar14 & 0xffffffff,local_148[0]);
          uVar3 = (uint)unaff_R13;
          if (uVar9 != 0xffffffff) {
            uVar3 = uVar15;
          }
          unaff_R13 = (char *)(ulong)uVar3;
          bVar17 = uVar9 == 0xffffffff;
        }
        iVar8 = (int)unaff_R13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_148[0] != local_138) {
          operator_delete(local_148[0],local_138[0] + 1);
        }
        paVar12 = local_120;
        uVar13 = local_68;
        if (!bVar17) goto LAB_002e2ed9;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < paVar12->mNumTextures);
    iVar8 = 0;
  }
LAB_002e2ed9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.logFile._M_dataplus._M_p != &local_60.logFile.field_2) {
    operator_delete(local_60.logFile._M_dataplus._M_p,
                    CONCAT71(local_60.logFile.field_2._M_allocated_capacity._1_7_,
                             local_60.logFile.field_2._M_local_buf[0]) + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    return iVar8;
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  return iVar8;
}

Assistant:

int Assimp_Extract (const char* const* params, unsigned int num)
{
    const char* const invalid = "assimp extract: Invalid number of arguments. See \'assimp extract --help\'\n";
    // assimp extract in out [options]
    if (num < 1) {
        printf(invalid);
        return 1;
    }

    // --help
    if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_DUMP_HELP_E);
        return 0;
    }



    std::string in  = std::string(params[0]);
    std::string out = (num > 1 ? std::string(params[1]) : "-");

    // get import flags
    ImportData import;
    ProcessStandardArguments(import,params+1,num-1);

    bool nosuffix = false;
    unsigned int texIdx  = 0xffffffff, flags = 0;

    // process other flags
    std::string extension = "bmp";
    for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
        if (!params[i]) {
            continue;
        }

        if (!strncmp( params[i], "-f",2)) {
            extension = std::string(params[i]+2);
        }
        else if ( !strncmp( params[i], "--format=",9)) {
            extension = std::string(params[i]+9);
        }
        else if ( !strcmp( params[i], "--nosuffix") || !strcmp(params[i],"-s")) {
            nosuffix = true;
        }
        else if ( !strncmp( params[i], "--texture=",10)) {
            texIdx = Assimp::strtoul10(params[i]+10);
        }
        else if ( !strncmp( params[i], "-t",2)) {
            texIdx = Assimp::strtoul10(params[i]+2);
        }
        else if ( !strcmp( params[i], "-ba") ||  !strcmp( params[i], "--bmp-with-alpha")) {
            flags |= AI_EXTRACT_WRITE_BMP_ALPHA;
        }
#if 0
        else {
            printf("Unknown parameter: %s\n",params[i]);
            return 10;
        }
#endif
    }

    std::transform(extension.begin(),extension.end(),extension.begin(),::tolower);
    
    if (out[0] == '-') {
        // take file name from input file
        std::string::size_type s = in.find_last_of('.');
        if (s == std::string::npos)
            s = in.length();

        out = in.substr(0,s);
    }

    // take file extension from file name, if given
    std::string::size_type s = out.find_last_of('.');
    if (s != std::string::npos) {
        extension = out.substr(s+1,in.length()-(s+1));
        out = out.substr(0,s);
    }

    // import the main model
    const aiScene* scene = ImportModel(import,in);
    if (!scene) {
        printf("assimp extract: Unable to load input file %s\n",in.c_str());
        return 5;
    }

    // get the texture(s) to be exported
    if (texIdx != 0xffffffff) {

        // check whether the requested texture is existing
        if (texIdx >= scene->mNumTextures) {
            ::printf("assimp extract: Texture %i requested, but there are just %i textures\n",
                texIdx, scene->mNumTextures);
            return 6;
        }
    }
    else {
        ::printf("assimp extract: Exporting %i textures\n",scene->mNumTextures);
    }

    // now write all output textures
    for (unsigned int i = 0; i < scene->mNumTextures;++i)	{
        if (texIdx != 0xffffffff && texIdx != i) {
            continue;
        }

        const aiTexture* tex = scene->mTextures[i];
        std::string out_cpy = out, out_ext = extension;

        // append suffix if necessary - always if all textures are exported
        if (!nosuffix || (texIdx == 0xffffffff)) {
            out_cpy.append  ("_img");
            char tmp[10];
            Assimp::ASSIMP_itoa10(tmp,i);

            out_cpy.append(std::string(tmp));
        }

        // if the texture is a compressed one, we'll export
        // it to its native file format
        if (!tex->mHeight) {
            printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                i,tex->achFormatHint);

            // modify file extension
            out_ext = std::string(tex->achFormatHint);
        }
        out_cpy.append("."+out_ext);

        // open output file
        FILE* p = ::fopen(out_cpy.c_str(),"wb");
        if (!p)  {
            printf("assimp extract: Unable to open output file %s\n",out_cpy.c_str());
            return 7;
        }
        int m;

        if (!tex->mHeight) {
            m = (1 != fwrite(tex->pcData,tex->mWidth,1,p));
        }
        else m = DoExport(tex,p,extension,flags);
        ::fclose(p);

        printf("assimp extract: Wrote texture %i to %s\n",i, out_cpy.c_str());
        if (texIdx != 0xffffffff)
            return m;
    }
    return 0;
}